

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_internal_buf_squeeze(mcpl_buffer_t *buf)

{
  char *__src;
  char *__dest;
  
  if (buf->size == buf->capacity) {
    return;
  }
  __src = buf->buf;
  __dest = mcpl_internal_malloc(buf->size);
  memcpy(__dest,__src,buf->size);
  buf->buf = __dest;
  free(__src);
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_buf_squeeze(mcpl_buffer_t* buf)
{
  if ( buf->size == buf->capacity )
    return;
  char * oldbuf = buf->buf;
  char * newbuf = mcpl_internal_malloc( buf->size );
  memcpy( newbuf, oldbuf, buf->size );
  buf->buf = newbuf;
  free(oldbuf);
}